

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11wm.cpp
# Opt level: O2

void __thiscall rw::X11WM::change_window_state(X11WM *this,Window *window,Atom operation,Atom state)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = XSendEvent(this->display,this->root_window,0,0x180000);
  if (iVar1 != 0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Could not change window state.");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

void X11WM::change_window_state(const Window *window, ::Atom operation,
                                    ::Atom state)
    {
        XEvent event;
        long mask = SubstructureRedirectMask | SubstructureNotifyMask;

        event.xclient.type = ClientMessage;
        event.xclient.serial = 0;
        event.xclient.send_event = True;
        event.xclient.message_type = _NET_WM_STATE;
        event.xclient.window = window->window_id;
        event.xclient.format = 32;
        event.xclient.data.l[0] = (unsigned long) operation;
        event.xclient.data.l[1] = (unsigned long) state;
        event.xclient.data.l[2] = (unsigned long) 0;
        event.xclient.data.l[3] = (unsigned long) 0;
        event.xclient.data.l[4] = (unsigned long) 0;

        if (!XSendEvent(display, root_window, False, mask, &event)) {
            cerr << "Could not change window state." << endl;
            exit(2);
        }
    }